

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_strglob(char *zGlobPattern,char *zString)

{
  int iVar1;
  
  if (zString == (char *)0x0) {
    return (int)(zGlobPattern != (char *)0x0);
  }
  if (zGlobPattern != (char *)0x0) {
    iVar1 = patternCompare((u8 *)zGlobPattern,(u8 *)zString,&globInfo,0x5b);
    return iVar1;
  }
  return 1;
}

Assistant:

SQLITE_API int sqlite3_strglob(const char *zGlobPattern, const char *zString){
  if( zString==0 ){
    return zGlobPattern!=0;
  }else if( zGlobPattern==0 ){
    return 1;
  }else {
    return patternCompare((u8*)zGlobPattern, (u8*)zString, &globInfo, '[');
  }
}